

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fReadPixelsTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  GLenum format_00;
  bool bVar1;
  GLenum GVar2;
  deBool dVar3;
  deInt32 dVar4;
  int iVar5;
  int iVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  PixelBufferAccess *access;
  reference pvVar9;
  RenderTarget *pRVar10;
  PixelFormat *pPVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *src;
  ConstPixelBufferAccess *pCVar13;
  ConstPixelBufferAccess *result;
  Enum<int,_2UL> EVar14;
  Vector<float,_4> local_568;
  ConstPixelBufferAccess local_558;
  float local_52c;
  float local_528;
  float alphaThreshold_1;
  float blueThreshold_1;
  float greenThreshold_1;
  float redThreshold_1;
  IVec4 formatBitDepths_1;
  TextureFormat local_4e0;
  undefined1 local_4d8 [8];
  Texture2D resultRGBA8;
  undefined1 local_480 [8];
  Texture2D referenceRGBA8;
  undefined1 local_428 [4];
  deUint8 alphaThreshold;
  deUint8 blueThreshold;
  deUint8 greenThreshold;
  deUint8 redThreshold;
  IVec4 formatBitDepths;
  undefined1 local_410 [4];
  int rowPitch;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  MessageBuilder local_3e8;
  float local_268;
  float local_264;
  float alpha;
  float blue;
  float green;
  float red;
  Texture2D reference;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8;
  MessageBuilder local_1c8;
  GLenum local_48;
  GLenum local_44;
  GLint glType;
  GLint glFormat;
  int pixelSize;
  TextureFormat local_30;
  TextureFormat format;
  Random rnd;
  int height;
  int width;
  ReadPixelsTest *this_local;
  
  de::Random::Random((Random *)&format,this->m_seed);
  tcu::TextureFormat::TextureFormat(&local_30,RGBA,UNORM_INT8);
  getFormatInfo(this,&local_30,(GLint *)&local_44,(GLint *)&local_48,&glType);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1c8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [9])"Format: ");
  EVar14 = glu::getTextureFormatStr(local_44);
  local_1e8 = EVar14.m_getName;
  local_1e0 = EVar14.m_value;
  local_1d8.m_getName = local_1e8;
  local_1d8.m_value = local_1e0;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1d8);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])", Type: ");
  EVar14 = glu::getTypeStr(local_48);
  reference.m_view.m_levels = (ConstPixelBufferAccess *)EVar14.m_getName;
  local_1f8.m_value = EVar14.m_value;
  local_1f8.m_getName = (GetNameFunc)reference.m_view.m_levels;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f8);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  tcu::Texture2D::Texture2D((Texture2D *)&green,&local_30,0xd,0xd);
  tcu::Texture2D::allocLevel((Texture2D *)&green,0);
  do {
    glwViewport(0,0,0xd,0xd);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glViewport(0, 0, width, height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0xbb);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  blue = de::Random::getFloat((Random *)&format);
  alpha = de::Random::getFloat((Random *)&format);
  local_264 = de::Random::getFloat((Random *)&format);
  local_268 = 1.0;
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3e8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_3e8,(char (*) [15])"Clear color: (");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&blue);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xafd70f);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&alpha);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xafd70f);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_264);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0xafd70f);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_268);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0xb1d50e);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  do {
    glwClearColor(blue,alpha,local_264,1.0);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glClearColor(red, green, blue, alpha)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,199);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    glwClear(0x4000);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,200);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  access = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)&green,0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,blue,alpha,local_264,1.0);
  tcu::clear(access,(Vec4 *)&pixelData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  render(this,(Texture2D *)&green);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410);
  iVar5 = this->m_alignment;
  dVar4 = deCeilFloatToInt32((float)(glType * 0xd) / (float)iVar5);
  formatBitDepths.m_data[3] = iVar5 * dVar4;
  formatBitDepths.m_data[2]._3_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410,
             (long)(formatBitDepths.m_data[3] * 0xd),
             (value_type_conflict4 *)((long)formatBitDepths.m_data + 0xb));
  do {
    glwPixelStorei(0xd05,this->m_alignment);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0xd4);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    format_00 = local_44;
    GVar2 = local_48;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410,0);
    glwReadPixels(0,0,0xd,0xd,format_00,GVar2,pvVar9);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0xd5);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getNumSamples(pRVar10);
  if (iVar5 < 2) {
    tcu::getTextureFormatBitDepth((tcu *)&greenThreshold_1,&local_30);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->redBits;
    iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&greenThreshold_1);
    iVar5 = ::deMin32(iVar5,iVar6);
    blueThreshold_1 = 2.0 / (float)(1 << ((byte)iVar5 & 0x1f));
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->greenBits;
    iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&greenThreshold_1);
    iVar5 = ::deMin32(iVar5,iVar6);
    alphaThreshold_1 = 2.0 / (float)(1 << ((byte)iVar5 & 0x1f));
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->blueBits;
    iVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&greenThreshold_1);
    iVar5 = ::deMin32(iVar5,iVar6);
    local_528 = 2.0 / (float)(1 << ((byte)iVar5 & 0x1f));
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->alphaBits;
    iVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&greenThreshold_1);
    iVar5 = ::deMin32(iVar5,iVar6);
    local_52c = 2.0 / (float)(1 << ((byte)iVar5 & 0x1f));
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pCVar13 = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)&green,0)->
               super_ConstPixelBufferAccess;
    iVar5 = formatBitDepths.m_data[3];
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_558,&local_30,0xd,0xd,1,iVar5,0,pvVar9);
    tcu::Vector<float,_4>::Vector(&local_568,blueThreshold_1,alphaThreshold_1,local_528,local_52c);
    bVar1 = tcu::floatThresholdCompare
                      (pTVar7,"Result","Result",pCVar13,&local_558,&local_568,COMPARE_LOG_RESULT);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::getTextureFormatBitDepth((tcu *)local_428,&local_30);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->redBits;
    iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_428);
    iVar5 = ::deMin32(iVar5,iVar6);
    dVar4 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar5 & 0x1f))) * 256.0);
    referenceRGBA8.m_view.m_levels._7_1_ = (byte)dVar4;
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->greenBits;
    iVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_428);
    iVar5 = ::deMin32(iVar5,iVar6);
    dVar4 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar5 & 0x1f))) * 256.0);
    referenceRGBA8.m_view.m_levels._6_1_ = (byte)dVar4;
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->blueBits;
    iVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_428);
    iVar5 = ::deMin32(iVar5,iVar6);
    dVar4 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar5 & 0x1f))) * 256.0);
    referenceRGBA8.m_view.m_levels._5_1_ = (byte)dVar4;
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar11 = tcu::RenderTarget::getPixelFormat(pRVar10);
    iVar5 = pPVar11->alphaBits;
    iVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_428);
    iVar5 = ::deMin32(iVar5,iVar6);
    dVar4 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)iVar5 & 0x1f))) * 256.0);
    referenceRGBA8.m_view.m_levels._4_1_ = (byte)dVar4;
    tcu::TextureFormat::TextureFormat((TextureFormat *)&resultRGBA8.m_view.m_levels,RGBA,UNORM_INT8)
    ;
    tcu::Texture2D::Texture2D
              ((Texture2D *)local_480,(TextureFormat *)&resultRGBA8.m_view.m_levels,0xd,0xd);
    tcu::TextureFormat::TextureFormat(&local_4e0,RGBA,UNORM_INT8);
    tcu::Texture2D::Texture2D((Texture2D *)local_4d8,&local_4e0,0xd,0xd);
    tcu::Texture2D::allocLevel((Texture2D *)local_480,0);
    tcu::Texture2D::allocLevel((Texture2D *)local_4d8,0);
    pEVar12 = (EVP_PKEY_CTX *)tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_480,0)
    ;
    src = (EVP_PKEY_CTX *)tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)&green,0);
    tcu::copy(pEVar12,src);
    pEVar12 = (EVP_PKEY_CTX *)tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_4d8,0)
    ;
    iVar5 = formatBitDepths.m_data[3];
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)(formatBitDepths_1.m_data + 3),&local_30,0xd,0xd,1,iVar5,0,
               pvVar9);
    tcu::copy(pEVar12,(EVP_PKEY_CTX *)(formatBitDepths_1.m_data + 3));
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pCVar13 = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_480,0)->
               super_ConstPixelBufferAccess;
    result = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_4d8,0)->
              super_ConstPixelBufferAccess;
    tcu::RGBA::RGBA((RGBA *)(formatBitDepths_1.m_data + 2),
                    (uint)referenceRGBA8.m_view.m_levels._7_1_,
                    (uint)referenceRGBA8.m_view.m_levels._6_1_,
                    (uint)referenceRGBA8.m_view.m_levels._5_1_,
                    (uint)referenceRGBA8.m_view.m_levels._4_1_);
    bVar1 = tcu::bilinearCompare
                      (pTVar7,"Result","Result",pCVar13,result,(RGBA)formatBitDepths_1.m_data[2],
                       COMPARE_LOG_RESULT);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    tcu::Texture2D::~Texture2D((Texture2D *)local_4d8);
    tcu::Texture2D::~Texture2D((Texture2D *)local_480);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_410);
  tcu::Texture2D::~Texture2D((Texture2D *)&green);
  de::Random::~Random((Random *)&format);
  return STOP;
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate (void)
{
	// Create reference
	const int					width	= 13;
	const int					height	= 13;

	de::Random					rnd(m_seed);

	tcu::TextureFormat			format(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
	int							pixelSize;
	GLint						glFormat;
	GLint						glType;

	getFormatInfo(format, glFormat, glType, pixelSize);
	m_testCtx.getLog() << tcu::TestLog::Message << "Format: " << glu::getTextureFormatStr(glFormat) << ", Type: " << glu::getTypeStr(glType) << tcu::TestLog::EndMessage;

	tcu::Texture2D reference(format, width, height);
	reference.allocLevel(0);

	GLU_CHECK_CALL(glViewport(0, 0, width, height));

	// Clear color
	{
		const float red		= rnd.getFloat();
		const float green	= rnd.getFloat();
		const float blue	= rnd.getFloat();
		const float alpha	= 1.0f;

		m_testCtx.getLog() << tcu::TestLog::Message << "Clear color: (" << red << ", " << green << ", " << blue << ", " << alpha << ")" << tcu::TestLog::EndMessage;

		// Clear target
		GLU_CHECK_CALL(glClearColor(red, green, blue, alpha));
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

		tcu::clear(reference.getLevel(0), tcu::Vec4(red, green, blue, alpha));
	}

	render(reference);

	std::vector<deUint8> pixelData;
	const int rowPitch = m_alignment * deCeilFloatToInt32(float(pixelSize * width) / (float)m_alignment);

	pixelData.resize(rowPitch * height, 0);

	GLU_CHECK_CALL(glPixelStorei(GL_PACK_ALIGNMENT, m_alignment));
	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0])));

	if (m_context.getRenderTarget().getNumSamples() > 1)
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const deUint8		redThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,	formatBitDepths.x()))));
		const deUint8		greenThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()))));
		const deUint8		blueThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()))));
		const deUint8		alphaThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()))));

		// bilinearCompare only accepts RGBA, UINT8
		tcu::Texture2D		referenceRGBA8	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
		tcu::Texture2D		resultRGBA8		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);

		referenceRGBA8.allocLevel(0);
		resultRGBA8.allocLevel(0);

		tcu::copy(referenceRGBA8.getLevel(0), reference.getLevel(0));
		tcu::copy(resultRGBA8.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])));

		if (tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Result", referenceRGBA8.getLevel(0), resultRGBA8.getLevel(0), tcu::RGBA(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const float			redThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,		formatBitDepths.x()));
		const float			greenThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()));
		const float			blueThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()));
		const float			alphaThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()));

		// Compare
		if (tcu::floatThresholdCompare(m_testCtx.getLog(), "Result", "Result", reference.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])), tcu::Vec4(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}